

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void SimpleScene(Stage *stage)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this;
  vector<int,_std::allocator<int>_> uvIndices;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> uvs;
  PrimVar uvIndexVar;
  XformOp op;
  double3 translate;
  Prim meshPrim;
  Prim xformPrim;
  vector<int,_std::allocator<int>_> counts;
  AttrMetas local_6ec8;
  Attribute uvIndexAttr;
  AttrMeta meta;
  Xform xform;
  GeomMesh mesh;
  
  tinyusdz::GPrim::GPrim(&xform.super_GPrim);
  std::__cxx11::string::assign((char *)&xform.super_GPrim.name);
  op.suffix._M_dataplus._M_p = (pointer)&op.suffix.field_2;
  op.inverted = false;
  op.suffix._M_string_length = 0;
  op.suffix.field_2._M_local_buf[0] = '\0';
  op._var._value.v_.vtable = (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  op._var._value.v_.storage.dynamic = (void *)0x0;
  op._var._blocked = false;
  op._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  op._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  op._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  op._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  op._var._ts._17_8_ = 0;
  op._is_blocked = false;
  op.op_type = Translate;
  translate._M_elems[0] = 1.0;
  translate._M_elems[1] = 2.0;
  translate._M_elems[2] = 3.0;
  linb::any::operator=((any *)&op._var,&translate);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)&xform,&op);
  tinyusdz::GeomMesh::GeomMesh(&mesh);
  std::__cxx11::string::assign((char *)&mesh.super_GPrim.name);
  xformPrim._abs_path._prim_part.field_2._M_allocated_capacity = 0;
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x0;
  xformPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x0;
  xformPrim._abs_path._prim_part._M_string_length = 0;
  meshPrim._abs_path._prim_part._M_string_length._0_4_ = 0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
  emplace_back<tinyusdz::value::point3f>
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             &xformPrim,(point3f *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x3f800000;
  meshPrim._abs_path._prim_part._M_string_length._0_4_ = 0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
  emplace_back<tinyusdz::value::point3f>
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             &xformPrim,(point3f *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  meshPrim._abs_path._prim_part._M_string_length._0_4_ = 0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
  emplace_back<tinyusdz::value::point3f>
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             &xformPrim,(point3f *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x3f80000000000000;
  meshPrim._abs_path._prim_part._M_string_length._0_4_ = 0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
  emplace_back<tinyusdz::value::point3f>
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             &xformPrim,(point3f *)&meshPrim);
  tinyusdz::
  Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
  Animatable((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
              *)&meshPrim,
             (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             &xformPrim);
  nonstd::optional_lite::
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>>
  ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>>
               *)&mesh.points._attrib,
              (Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
               *)&meshPrim);
  tinyusdz::
  Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
  ~Animatable((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
               *)&meshPrim);
  std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
  ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *
                )&xformPrim);
  xformPrim._abs_path._prim_part.field_2._M_allocated_capacity = 0;
  xformPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x0;
  xformPrim._abs_path._prim_part._M_string_length = 0;
  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&counts,(int *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&counts,(int *)&meshPrim);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim,&counts);
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>>::
  operator=((optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>> *)
            &mesh.faceVertexCounts._attrib,
            (Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p =
       meshPrim._abs_path._prim_part._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&xformPrim,(int *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&xformPrim,(int *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&xformPrim,(int *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p =
       meshPrim._abs_path._prim_part._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&xformPrim,(int *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&xformPrim,(int *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&xformPrim,(int *)&meshPrim);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim,
             (vector<int,_std::allocator<int>_> *)&xformPrim);
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>>::
  operator=((optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>> *)
            &mesh.faceVertexIndices._attrib,
            (Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&counts.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&xformPrim);
  tinyusdz::Attribute::Attribute((Attribute *)&counts);
  uvs.super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uvs.super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uvs.super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x0;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
  emplace_back<tinyusdz::value::texcoord2f>(&uvs,(texcoord2f *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x3f800000;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
  emplace_back<tinyusdz::value::texcoord2f>(&uvs,(texcoord2f *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
  emplace_back<tinyusdz::value::texcoord2f>(&uvs,(texcoord2f *)&meshPrim);
  meshPrim._abs_path._prim_part._M_dataplus._M_p = (pointer)0x3f80000000000000;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
  emplace_back<tinyusdz::value::texcoord2f>(&uvs,(texcoord2f *)&meshPrim);
  tinyusdz::Attribute::
  set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
            ((Attribute *)&counts,&uvs);
  tinyusdz::AttrMetas::AttrMetas(&meta);
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_1_ = 1;
  meshPrim._abs_path._prim_part._M_dataplus._M_p._4_4_ = 3;
  nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
            (&meta.interpolation,(optional<tinyusdz::Interpolation> *)&meshPrim);
  tinyusdz::AttrMetas::operator=(&local_6ec8,&meta);
  tinyusdz::Property::Property((Property *)&meshPrim,(Attribute *)&counts,false);
  this = &mesh.super_GPrim.props;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[12],tinyusdz::Property&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)this,(char (*) [12])"primvars:uv",(Property *)&meshPrim);
  tinyusdz::Attribute::Attribute(&uvIndexAttr);
  uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  xformPrim._abs_path._prim_part._M_dataplus._M_p =
       xformPrim._abs_path._prim_part._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&uvIndices,(int *)&xformPrim);
  xformPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&uvIndices,(int *)&xformPrim);
  xformPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&uvIndices,(int *)&xformPrim);
  xformPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&uvIndices,(int *)&xformPrim);
  uvIndexVar._value.v_.vtable =
       (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  uvIndexVar._value.v_.storage.dynamic = (void *)0x0;
  uvIndexVar._blocked = false;
  uvIndexVar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uvIndexVar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  uvIndexVar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  uvIndexVar._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  uvIndexVar._ts._17_8_ = 0;
  linb::any::operator=((any *)&uvIndexVar,&uvIndices);
  tinyusdz::Attribute::set_var(&uvIndexAttr,&uvIndexVar);
  tinyusdz::Property::Property((Property *)&xformPrim,&uvIndexAttr,false);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[20],tinyusdz::Property&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)this,(char (*) [20])"primvars:uv:indices",(Property *)&xformPrim);
  tinyusdz::Property::~Property((Property *)&xformPrim);
  tinyusdz::primvar::PrimVar::~PrimVar(&uvIndexVar);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&uvIndices.super__Vector_base<int,_std::allocator<int>_>);
  tinyusdz::Attribute::~Attribute(&uvIndexAttr);
  tinyusdz::Property::~Property((Property *)&meshPrim);
  tinyusdz::AttrMetas::~AttrMetas(&meta);
  std::_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
  ~_Vector_base(&uvs.
                 super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
               );
  tinyusdz::Attribute::~Attribute((Attribute *)&counts);
  tinyusdz::Attribute::Attribute((Attribute *)&xformPrim);
  meta.interpolation.has_value_ = false;
  meta.interpolation._1_3_ = 0;
  meta.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x40080000;
  uvIndexAttr._name.field_2._M_allocated_capacity =
       (size_type)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  uvIndexAttr._name._M_dataplus._M_p = (pointer)0x0;
  uvIndexAttr._name.field_2._M_local_buf[8] = '\0';
  uvIndexAttr._variability = Varying;
  uvIndexAttr._varying_authored = false;
  uvIndexAttr._37_3_ = 0;
  uvIndexAttr._type_name._M_dataplus._M_p._0_1_ = 0;
  uvIndexAttr._type_name._M_dataplus._M_p._1_7_ = 0;
  uvIndexAttr._type_name._M_string_length._0_1_ = 0;
  uvIndexAttr._type_name._9_8_ = 0;
  linb::any::operator=((any *)&uvIndexAttr,(double *)&meta);
  tinyusdz::Attribute::set_var((Attribute *)&xformPrim,(PrimVar *)&uvIndexAttr);
  xformPrim._abs_path._prop_part._M_dataplus._M_p._0_4_ = 1;
  tinyusdz::AttrMetas::AttrMetas((AttrMetas *)&counts);
  meshPrim._abs_path._prim_part._M_dataplus._M_p._0_2_ = 1;
  nonstd::optional_lite::optional<bool>::operator=
            ((optional<bool> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(optional<bool> *)&meshPrim);
  tinyusdz::AttrMetas::operator=((AttrMetas *)&xformPrim._abs_path._element,(AttrMetas *)&counts);
  tinyusdz::Property::Property((Property *)&meshPrim,(Attribute *)&xformPrim,true);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[8],tinyusdz::Property&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)this,(char (*) [8])"myvalue",(Property *)&meshPrim);
  tinyusdz::Property::~Property((Property *)&meshPrim);
  tinyusdz::AttrMetas::~AttrMetas((AttrMetas *)&counts);
  tinyusdz::primvar::PrimVar::~PrimVar((PrimVar *)&uvIndexAttr);
  tinyusdz::Attribute::~Attribute((Attribute *)&xformPrim);
  tinyusdz::Prim::Prim<tinyusdz::GeomMesh>(&meshPrim,&mesh);
  tinyusdz::Prim::Prim<tinyusdz::Xform>(&xformPrim,&xform);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            (&xformPrim._children,&meshPrim);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            (&stage->_root_nodes,&xformPrim);
  tinyusdz::Prim::~Prim(&xformPrim);
  tinyusdz::Prim::~Prim(&meshPrim);
  tinyusdz::GeomMesh::~GeomMesh(&mesh);
  tinyusdz::XformOp::~XformOp(&op);
  tinyusdz::GPrim::~GPrim(&xform.super_GPrim);
  return;
}

Assistant:

void SimpleScene(tinyusdz::Stage *stage)
{
  //
  // tinyusdz currently does not provide scene construction API yet, so edit parameters directly.
  //
  // TinyUSDZ does not use mutex, smart pointers(e.g. shared_ptr) and C++ exception.
  // API is not multi-thread safe, thus if you need to manipulate a scene in multi-threaded context,
  // The app must take care of resource locks in app layer.
  //
  tinyusdz::Xform xform;
  xform.name = "root";

  tinyusdz::XformOp op;
  op.op_type = tinyusdz::XformOp::OpType::Translate;
  tinyusdz::value::double3 translate;
  translate[0] = 1.0;
  translate[1] = 2.0;
  translate[2] = 3.0;
  op.set_value(translate);

  xform.xformOps.push_back(op);

  tinyusdz::GeomMesh mesh;
  mesh.name = "quad";

  {
    std::vector<tinyusdz::value::point3f> pts;
    pts.push_back({0.0f, 0.0f, 0.0f});

    pts.push_back({1.0f, 0.0f, 0.0f});

    pts.push_back({1.0f, 1.0f, 0.0f});

    pts.push_back({0.0f, 1.0f, 0.0f});

    mesh.points.set_value(pts);
  }

  {
    // quad plane composed of 2 triangles.
    std::vector<int> indices;
    std::vector<int> counts;
    counts.push_back(3);
    counts.push_back(3);
    mesh.faceVertexCounts.set_value(counts);

    indices.push_back(0);
    indices.push_back(1);
    indices.push_back(2);

    indices.push_back(0);
    indices.push_back(2);
    indices.push_back(3);

    mesh.faceVertexIndices.set_value(indices);
  }

  // primvar and custom attribute can be added to generic Property container `props`
  {
    // primvar is simply an attribute with prefix `primvars:`
    //
    // texCoord2f[] primvars:uv = [ ... ] ( interpolation = "vertex" )
    // int[] primvars:uv:indices = [ ... ]
    //
    {
      tinyusdz::Attribute uvAttr;
      std::vector<tinyusdz::value::texcoord2f> uvs;

      uvs.push_back({0.0f, 0.0f});
      uvs.push_back({1.0f, 0.0f});
      uvs.push_back({1.0f, 1.0f});
      uvs.push_back({0.0f, 1.0f});

      // Fast path. Set the value directly to Attribute.
      uvAttr.set_value(uvs);

      // or we can first build primvar::PrimVar
      //tinyusdz::primvar::PrimVar uvVar;
      //uvVar.set_value(uvs);
      //uvAttr.set_var(std::move(uvVar));

      // Currently `interpolation` is described in Attribute metadataum.
      tinyusdz::AttrMeta meta;
      meta.interpolation = tinyusdz::Interpolation::Vertex;
      uvAttr.metas() = meta;

      tinyusdz::Property uvProp(uvAttr, /* custom*/false);

      mesh.props.emplace("primvars:uv", uvProp);

      // ----------------------

      tinyusdz::Attribute uvIndexAttr;
      std::vector<int> uvIndices;

      // FIXME: Validate
      uvIndices.push_back(0);
      uvIndices.push_back(1);
      uvIndices.push_back(2);
      uvIndices.push_back(3);


      tinyusdz::primvar::PrimVar uvIndexVar;
      uvIndexVar.set_value(uvIndices);
      uvIndexAttr.set_var(std::move(uvIndexVar));

      tinyusdz::Property uvIndexProp(uvIndexAttr, /* custom*/false);
      mesh.props.emplace("primvars:uv:indices", uvIndexProp);

    }

    // `custom uniform double myvalue = 3.0 ( hidden = 0 )`
    {
      tinyusdz::Attribute attrib;
      double myvalue = 3.0;
      tinyusdz::primvar::PrimVar var;
      var.set_value(myvalue);
      attrib.set_var(std::move(var));

      attrib.variability() = tinyusdz::Variability::Uniform;

      tinyusdz::AttrMeta meta;
      meta.hidden = false;
      attrib.metas() = meta;

      tinyusdz::Property prop(attrib, /* custom*/true);

      mesh.props.emplace("myvalue", prop);
    }

  }

  tinyusdz::Prim meshPrim(mesh);
  tinyusdz::Prim xformPrim(xform);

  // [Xform]
  //  |
  //  +- [Mesh]
  //
  xformPrim.children().emplace_back(std::move(meshPrim));

  stage->root_prims().emplace_back(std::move(xformPrim));
}